

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O3

void __thiscall
cmdline::parser::add<std::__cxx11::string,cmdline::default_reader<std::__cxx11::string>>
          (parser *this,key_type *name,char short_name,string *desc,bool need,long *def)

{
  pointer *pppoVar1;
  iterator __position;
  const_iterator cVar2;
  option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  mapped_type *ppoVar3;
  cmdline_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = desc;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->options)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)operator_new(0xa0);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_78,*def,def[1] + *def);
    option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::option_with_value(this_00,name,short_name,need,&local_78,local_58);
    (this_00->super_option_base)._vptr_option_base = (_func_int **)&PTR__option_with_value_001209f8;
    ppoVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
              ::operator[](&this->options,name);
    *ppoVar3 = (mapped_type)this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    ppoVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
              ::operator[](&this->options,name);
    __position._M_current =
         (this->ordered).
         super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->ordered).
        super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmdline::parser::option_base*,std::allocator<cmdline::parser::option_base*>>::
      _M_realloc_insert<cmdline::parser::option_base*const&>
                ((vector<cmdline::parser::option_base*,std::allocator<cmdline::parser::option_base*>>
                  *)&this->ordered,__position,ppoVar3);
    }
    else {
      *__position._M_current = *ppoVar3;
      pppoVar1 = &(this->ordered).
                  super__Vector_base<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppoVar1 = *pppoVar1 + 1;
    }
    return;
  }
  this_01 = (cmdline_error *)__cxa_allocate_exception(0x28);
  std::operator+(&local_50,"multiple definition: ",name);
  cmdline_error::cmdline_error(this_01,&local_50);
  __cxa_throw(this_01,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
}

Assistant:

void add(const std::string& name, char short_name = 0, const std::string& desc = "", bool need = true,
             const T def = T(), F reader = F()) {
        if (options.count(name)) throw cmdline_error("multiple definition: " + name);
        options[name] = new option_with_value_with_reader<T, F>(name, short_name, need, def, desc, reader);
        ordered.push_back(options[name]);
    }